

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_MOVE_ATTACK(effect_handler_context_t *context)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  monster *pmVar4;
  loc_conflict lVar5;
  loc grid;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  _Bool fear;
  loc target;
  
  wVar2 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  target.x = (player->grid).x;
  target.y = (player->grid).y;
  if ((long)context->dir == 5) {
    target_get((loc_conflict *)&target);
  }
  else {
    target = (loc)loc_sum((loc_conflict)target,(loc_conflict)ddgrid[context->dir]);
  }
  pmVar4 = square_monster(cave,target);
  if ((pmVar4 != (monster *)0x0) && (_Var1 = monster_is_obvious(pmVar4), _Var1)) {
    iVar7 = 4;
    while( true ) {
      wVar3 = distance(player->grid,(loc_conflict)target);
      if ((wVar3 < L'\x02') || (iVar7 == 0)) break;
      lVar5 = loc_diff((loc_conflict)target,player->grid);
      if (lVar5.x == 0) {
        uVar9 = (uint)(-1 < (long)lVar5) << 2;
      }
      else if ((ulong)lVar5 >> 0x20 == 0) {
        uVar9 = ((uint)((ulong)lVar5 >> 0x1f) & 1) * 4 + 2;
      }
      else if (lVar5.x < 0) {
        uVar9 = (lVar5.y >> 0x1f) * -2 + 5;
      }
      else {
        uVar9 = (uint)(-1 < (long)lVar5) * 2 + 1;
      }
      lVar8 = 0;
      while( true ) {
        iVar6 = (int)(*(int *)((long)&DAT_00248460 + lVar8) + (uVar9 | 8)) % 8;
        grid = (loc)loc_sum(player->grid,(loc_conflict)clockwise_grid[iVar6]);
        _Var1 = square_ispassable(cave,grid);
        if (_Var1) break;
        lVar8 = lVar8 + 4;
        if (lVar8 == 0xc) {
          msg("The way is barred.");
          return iVar7 != 4;
        }
      }
      pmVar4 = square_monster(cave,grid);
      move_player((int)clockwise_ddd[iVar6],false);
      iVar7 = iVar7 + -1;
      if (pmVar4 != (monster *)0x0) {
        return false;
      }
    }
    iVar7 = (iVar7 * wVar2 + 2) / 4 + 1;
    do {
      if (iVar7 + -1 == 0 || iVar7 < 1) {
        return true;
      }
      _Var1 = py_attack_real(player,target,&fear);
      iVar7 = iVar7 + -1;
    } while (!_Var1);
    return true;
  }
  msg("This spell must target a monster.");
  return false;
}

Assistant:

bool effect_handler_MOVE_ATTACK(effect_handler_context_t *context)
{
	int blows = effect_calculate_value(context, false);
	int moves = 4;
	int d, i;
	struct loc target = player->grid;
	struct loc next_grid, grid_diff;
	bool fear;
	struct monster *mon;

	/* Ask for a target */
	if (context->dir == DIR_TARGET) {
		target_get(&target);
	} else {
		target = loc_sum(player->grid, ddgrid[context->dir]);
	}

	mon = square_monster(cave, target);
	if (mon == NULL || !monster_is_obvious(mon)) {
		msg("This spell must target a monster.");
		return false;
	}

	while (distance(player->grid, target) > 1 && moves > 0) {
		int choice[] = { 0, 1, -1 };
		bool attack = false;
		grid_diff = loc_diff(target, player->grid);

		/* Choice of direction simplified by prioritizing diagonals */
		if (grid_diff.x == 0) {
			d = (grid_diff.y < 0) ? 0 : 4; /* up : down */
		} else if (grid_diff.y == 0) {
			d = (grid_diff.x < 0) ? 6 : 2; /* left : right */
		} else if (grid_diff.x < 0) {
			d = (grid_diff.y < 0) ? 7 : 5; /* up-left : down-left */
		} else {/* grid_diff.x > 0 */
			d = (grid_diff.y < 0) ? 1 : 3; /* up-right : down-right */
		}

		/* We'll give up to 3 choices: d, d + 1, d - 1 */
		for (i = 0; i < 3; i++) {
			int d_test = (d + choice[i] + 8) % 8;
			next_grid = loc_sum(player->grid, clockwise_grid[d_test]);
			if (square_ispassable(cave, next_grid)) {
				d = d_test;
				if (square_monster(cave, next_grid)) attack = true;
				break;
			} else if (i == 2) {
				msg("The way is barred.");
				return moves != 4;
			}
		}

		move_player(clockwise_ddd[d], false);
		moves--;
		if (attack) return false;
	}

	/* Reduce blows based on distance traveled, round to nearest blow */
	blows = (blows * moves + 2) / 4;

	/* Should return some energy if monster dies early */
	while (blows-- > 0) {
		if (py_attack_real(player, target, &fear)) break;
	}

	return true;
}